

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linei_intersector.h
# Opt level: O1

void embree::avx::FlatLinearCurveMiIntersector1<8,_true>::intersect
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *line)

{
  undefined4 uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  Geometry *pGVar9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  uint uVar16;
  uint uVar17;
  Scene *pSVar18;
  ulong uVar19;
  float fVar20;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  float fVar31;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar38;
  float fVar39;
  float fVar41;
  float fVar42;
  float fVar43;
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  float fVar40;
  undefined1 auVar37 [32];
  float fVar44;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [64];
  undefined1 auVar66 [32];
  float fVar68;
  undefined1 auVar67 [32];
  float fVar69;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  undefined1 auVar70 [32];
  float fVar77;
  float fVar78;
  float fVar79;
  undefined1 auVar80 [32];
  float in_register_0000151c;
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vbool<8> valid;
  LineIntersectorHitM<8> hit;
  int local_314;
  Scene *local_310;
  RayQueryContext *local_308;
  RTCFilterFunctionNArguments local_300;
  float local_2d0;
  undefined4 local_2cc;
  undefined4 local_2c8;
  undefined4 local_2c4;
  undefined4 local_2c0;
  uint local_2bc;
  uint local_2b8;
  uint local_2b4;
  uint local_2b0;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [16];
  undefined1 local_210 [16];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar62 [64];
  
  local_308 = context;
  pSVar18 = context->scene;
  uVar17 = line->sharedGeomID;
  uVar16 = (line->v0).field_0.i[0];
  local_310 = pSVar18;
  pGVar9 = (pSVar18->geometries).items[uVar17].ptr;
  lVar10 = *(long *)&pGVar9[1].time_range.upper;
  p_Var11 = pGVar9[1].intersectionFilterN;
  uVar2 = (line->v0).field_0.i[1];
  uVar3 = (line->v0).field_0.i[2];
  uVar4 = (line->v0).field_0.i[4];
  auVar21._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar4 * (long)p_Var11);
  auVar21._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar16 * (long)p_Var11);
  uVar5 = (line->v0).field_0.i[5];
  auVar35._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar5 * (long)p_Var11);
  auVar35._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar2 * (long)p_Var11);
  uVar6 = (line->v0).field_0.i[6];
  auVar45._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar6 * (long)p_Var11);
  auVar45._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar3 * (long)p_Var11);
  uVar7 = (line->v0).field_0.i[3];
  uVar8 = (line->v0).field_0.i[7];
  auVar53._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar8 * (long)p_Var11);
  auVar53._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar7 * (long)p_Var11);
  auVar56._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar4 + 1) * (long)p_Var11);
  auVar56._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar16 + 1) * (long)p_Var11);
  auVar59._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar5 + 1) * (long)p_Var11);
  auVar59._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar2 + 1) * (long)p_Var11);
  auVar63._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar6 + 1) * (long)p_Var11);
  auVar63._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar3 + 1) * (long)p_Var11);
  auVar70._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar8 + 1) * (long)p_Var11);
  auVar70._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar7 + 1) * (long)p_Var11);
  auVar13 = vunpcklps_avx(auVar21,auVar45);
  auVar24 = vunpckhps_avx(auVar21,auVar45);
  auVar82 = vunpcklps_avx(auVar35,auVar53);
  auVar12 = vunpckhps_avx(auVar35,auVar53);
  local_2a0 = vunpcklps_avx(auVar13,auVar82);
  local_120 = vunpckhps_avx(auVar13,auVar82);
  local_140 = vunpcklps_avx(auVar24,auVar12);
  local_a0 = vunpckhps_avx(auVar24,auVar12);
  auVar13 = vunpcklps_avx(auVar56,auVar63);
  auVar24 = vunpckhps_avx(auVar56,auVar63);
  auVar82 = vunpcklps_avx(auVar59,auVar70);
  auVar12 = vunpckhps_avx(auVar59,auVar70);
  local_e0 = vunpcklps_avx(auVar13,auVar82);
  local_100 = vunpckhps_avx(auVar13,auVar82);
  local_240 = vunpcklps_avx(auVar24,auVar12);
  local_c0 = vunpckhps_avx(auVar24,auVar12);
  auVar33 = vpcmpeqd_avx(local_c0._0_16_,local_c0._0_16_);
  auVar34 = vpcmpeqd_avx(auVar33,*(undefined1 (*) [16])(line->primIDs).field_0.field_1.vl);
  auVar33 = vpcmpeqd_avx(auVar33,*(undefined1 (*) [16])((long)&(line->primIDs).field_0 + 0x10));
  local_80._16_16_ = auVar33;
  local_80._0_16_ = auVar34;
  local_210 = vshufps_avx(ZEXT416(uVar17),ZEXT416(uVar17),0);
  local_220 = local_210;
  fVar44 = (pre->ray_space).vy.field_0.m128[0];
  fVar20 = (pre->ray_space).vy.field_0.m128[1];
  fVar26 = (pre->ray_space).vz.field_0.m128[0];
  fVar27 = (pre->ray_space).vz.field_0.m128[1];
  fVar68 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
  auVar66._4_4_ = fVar68;
  auVar66._0_4_ = fVar68;
  auVar66._8_4_ = fVar68;
  auVar66._12_4_ = fVar68;
  auVar66._16_4_ = fVar68;
  auVar66._20_4_ = fVar68;
  auVar66._24_4_ = fVar68;
  auVar66._28_4_ = fVar68;
  uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
  auVar36._4_4_ = uVar1;
  auVar36._0_4_ = uVar1;
  auVar36._8_4_ = uVar1;
  auVar36._12_4_ = uVar1;
  auVar36._16_4_ = uVar1;
  auVar36._20_4_ = uVar1;
  auVar36._24_4_ = uVar1;
  auVar36._28_4_ = uVar1;
  auVar24 = vsubps_avx(local_120,auVar66);
  auVar12 = vsubps_avx(local_140,auVar36);
  fVar41 = auVar12._0_4_;
  fVar42 = auVar12._4_4_;
  fVar43 = auVar12._8_4_;
  fVar38 = auVar12._12_4_;
  fVar40 = auVar12._16_4_;
  fVar48 = auVar12._20_4_;
  fVar77 = auVar12._24_4_;
  fVar51 = auVar24._0_4_;
  fVar52 = auVar24._4_4_;
  fVar32 = auVar24._8_4_;
  fVar39 = auVar24._12_4_;
  fVar47 = auVar24._16_4_;
  fVar49 = auVar24._20_4_;
  fVar78 = auVar24._24_4_;
  fVar28 = (pre->ray_space).vy.field_0.m128[2];
  fVar29 = (pre->ray_space).vz.field_0.m128[2];
  fVar79 = auVar12._28_4_;
  fVar30 = (pre->ray_space).vx.field_0.m128[0];
  uVar1 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
  auVar64._4_4_ = uVar1;
  auVar64._0_4_ = uVar1;
  auVar64._8_4_ = uVar1;
  auVar64._12_4_ = uVar1;
  auVar64._16_4_ = uVar1;
  auVar64._20_4_ = uVar1;
  auVar64._24_4_ = uVar1;
  auVar64._28_4_ = uVar1;
  auVar12 = vsubps_avx(local_2a0,auVar64);
  fVar69 = auVar12._0_4_;
  fVar71 = auVar12._4_4_;
  fVar72 = auVar12._8_4_;
  fVar73 = auVar12._12_4_;
  fVar74 = auVar12._16_4_;
  fVar75 = auVar12._20_4_;
  fVar76 = auVar12._24_4_;
  auVar46._0_4_ = fVar69 * fVar30 + fVar26 * fVar41 + fVar44 * fVar51;
  auVar46._4_4_ = fVar71 * fVar30 + fVar26 * fVar42 + fVar44 * fVar52;
  auVar46._8_4_ = fVar72 * fVar30 + fVar26 * fVar43 + fVar44 * fVar32;
  auVar46._12_4_ = fVar73 * fVar30 + fVar26 * fVar38 + fVar44 * fVar39;
  auVar46._16_4_ = fVar74 * fVar30 + fVar26 * fVar40 + fVar44 * fVar47;
  auVar46._20_4_ = fVar75 * fVar30 + fVar26 * fVar48 + fVar44 * fVar49;
  auVar46._24_4_ = fVar76 * fVar30 + fVar26 * fVar77 + fVar44 * fVar78;
  auVar46._28_4_ = fVar79 + in_register_0000151c + local_120._28_4_;
  fVar31 = (pre->ray_space).vx.field_0.m128[1];
  auVar80._0_4_ = fVar69 * fVar31 + fVar20 * fVar51 + fVar27 * fVar41;
  auVar80._4_4_ = fVar71 * fVar31 + fVar20 * fVar52 + fVar27 * fVar42;
  auVar80._8_4_ = fVar72 * fVar31 + fVar20 * fVar32 + fVar27 * fVar43;
  auVar80._12_4_ = fVar73 * fVar31 + fVar20 * fVar39 + fVar27 * fVar38;
  auVar80._16_4_ = fVar74 * fVar31 + fVar20 * fVar47 + fVar27 * fVar40;
  auVar80._20_4_ = fVar75 * fVar31 + fVar20 * fVar49 + fVar27 * fVar48;
  auVar80._24_4_ = fVar76 * fVar31 + fVar20 * fVar78 + fVar27 * fVar77;
  auVar80._28_4_ = fVar79 + local_140._28_4_ + in_register_0000151c;
  fVar50 = (pre->ray_space).vx.field_0.m128[2];
  auVar81._0_4_ = fVar50 * fVar69 + fVar51 * fVar28 + fVar41 * fVar29;
  auVar81._4_4_ = fVar50 * fVar71 + fVar52 * fVar28 + fVar42 * fVar29;
  auVar81._8_4_ = fVar50 * fVar72 + fVar32 * fVar28 + fVar43 * fVar29;
  auVar81._12_4_ = fVar50 * fVar73 + fVar39 * fVar28 + fVar38 * fVar29;
  auVar81._16_4_ = fVar50 * fVar74 + fVar47 * fVar28 + fVar40 * fVar29;
  auVar81._20_4_ = fVar50 * fVar75 + fVar49 * fVar28 + fVar48 * fVar29;
  auVar81._24_4_ = fVar50 * fVar76 + fVar78 * fVar28 + fVar77 * fVar29;
  auVar81._28_4_ = auVar12._28_4_ + auVar24._28_4_ + fVar79;
  auVar24 = vsubps_avx(local_240,auVar36);
  fVar41 = auVar24._0_4_;
  fVar52 = auVar24._4_4_;
  fVar38 = auVar24._8_4_;
  fVar47 = auVar24._12_4_;
  fVar77 = auVar24._16_4_;
  fVar69 = auVar24._20_4_;
  fVar73 = auVar24._24_4_;
  auVar12 = vsubps_avx(local_100,auVar66);
  fVar51 = auVar12._0_4_;
  fVar43 = auVar12._4_4_;
  fVar39 = auVar12._8_4_;
  fVar48 = auVar12._12_4_;
  fVar78 = auVar12._16_4_;
  fVar71 = auVar12._20_4_;
  fVar74 = auVar12._24_4_;
  fVar68 = local_240._28_4_ + fVar68;
  auVar13 = vsubps_avx(local_e0,auVar64);
  fVar42 = auVar13._0_4_;
  fVar32 = auVar13._4_4_;
  fVar40 = auVar13._8_4_;
  fVar49 = auVar13._12_4_;
  fVar79 = auVar13._16_4_;
  fVar72 = auVar13._20_4_;
  fVar75 = auVar13._24_4_;
  auVar57._0_4_ = fVar30 * fVar42 + fVar26 * fVar41 + fVar44 * fVar51;
  auVar57._4_4_ = fVar30 * fVar32 + fVar26 * fVar52 + fVar44 * fVar43;
  auVar57._8_4_ = fVar30 * fVar40 + fVar26 * fVar38 + fVar44 * fVar39;
  auVar57._12_4_ = fVar30 * fVar49 + fVar26 * fVar47 + fVar44 * fVar48;
  auVar57._16_4_ = fVar30 * fVar79 + fVar26 * fVar77 + fVar44 * fVar78;
  auVar57._20_4_ = fVar30 * fVar72 + fVar26 * fVar69 + fVar44 * fVar71;
  auVar57._24_4_ = fVar30 * fVar75 + fVar26 * fVar73 + fVar44 * fVar74;
  auVar57._28_4_ = auVar12._28_4_ + fVar68;
  auVar60._0_4_ = fVar20 * fVar51 + fVar27 * fVar41 + fVar31 * fVar42;
  auVar60._4_4_ = fVar20 * fVar43 + fVar27 * fVar52 + fVar31 * fVar32;
  auVar60._8_4_ = fVar20 * fVar39 + fVar27 * fVar38 + fVar31 * fVar40;
  auVar60._12_4_ = fVar20 * fVar48 + fVar27 * fVar47 + fVar31 * fVar49;
  auVar60._16_4_ = fVar20 * fVar78 + fVar27 * fVar77 + fVar31 * fVar79;
  auVar60._20_4_ = fVar20 * fVar71 + fVar27 * fVar69 + fVar31 * fVar72;
  auVar60._24_4_ = fVar20 * fVar74 + fVar27 * fVar73 + fVar31 * fVar75;
  auVar60._28_4_ = local_240._28_4_ + fVar26 + fVar31;
  auVar22._0_4_ = fVar50 * fVar42 + fVar28 * fVar51 + fVar29 * fVar41;
  auVar22._4_4_ = fVar50 * fVar32 + fVar28 * fVar43 + fVar29 * fVar52;
  auVar22._8_4_ = fVar50 * fVar40 + fVar28 * fVar39 + fVar29 * fVar38;
  auVar22._12_4_ = fVar50 * fVar49 + fVar28 * fVar48 + fVar29 * fVar47;
  auVar22._16_4_ = fVar50 * fVar79 + fVar28 * fVar78 + fVar29 * fVar77;
  auVar22._20_4_ = fVar50 * fVar72 + fVar28 * fVar71 + fVar29 * fVar69;
  auVar22._24_4_ = fVar50 * fVar75 + fVar28 * fVar74 + fVar29 * fVar73;
  auVar22._28_4_ = fVar31 + fVar28 + auVar24._28_4_;
  auVar12 = vsubps_avx(auVar57,auVar46);
  auVar24 = vsubps_avx(auVar60,auVar80);
  fVar44 = auVar24._0_4_;
  fVar26 = auVar24._4_4_;
  fVar28 = auVar24._8_4_;
  fVar30 = auVar24._12_4_;
  fVar50 = auVar24._16_4_;
  fVar51 = auVar24._20_4_;
  fVar52 = auVar24._24_4_;
  fVar20 = auVar12._0_4_;
  fVar27 = auVar12._4_4_;
  fVar29 = auVar12._8_4_;
  fVar31 = auVar12._12_4_;
  fVar41 = auVar12._16_4_;
  fVar42 = auVar12._20_4_;
  fVar43 = auVar12._24_4_;
  auVar58._0_4_ = fVar20 * fVar20 + fVar44 * fVar44;
  auVar58._4_4_ = fVar27 * fVar27 + fVar26 * fVar26;
  auVar58._8_4_ = fVar29 * fVar29 + fVar28 * fVar28;
  auVar58._12_4_ = fVar31 * fVar31 + fVar30 * fVar30;
  auVar58._16_4_ = fVar41 * fVar41 + fVar50 * fVar50;
  auVar58._20_4_ = fVar42 * fVar42 + fVar51 * fVar51;
  auVar58._24_4_ = fVar43 * fVar43 + fVar52 * fVar52;
  auVar58._28_4_ = auVar60._28_4_ + auVar57._28_4_;
  auVar13._4_4_ = fVar26 * -auVar80._4_4_;
  auVar13._0_4_ = fVar44 * -auVar80._0_4_;
  auVar13._8_4_ = fVar28 * -auVar80._8_4_;
  auVar13._12_4_ = fVar30 * -auVar80._12_4_;
  auVar13._16_4_ = fVar50 * -auVar80._16_4_;
  auVar13._20_4_ = fVar51 * -auVar80._20_4_;
  auVar13._24_4_ = fVar52 * -auVar80._24_4_;
  auVar13._28_4_ = -auVar80._28_4_;
  auVar24 = vrcpps_avx(auVar58);
  auVar82._4_4_ = auVar46._4_4_ * fVar27;
  auVar82._0_4_ = auVar46._0_4_ * fVar20;
  auVar82._8_4_ = auVar46._8_4_ * fVar29;
  auVar82._12_4_ = auVar46._12_4_ * fVar31;
  auVar82._16_4_ = auVar46._16_4_ * fVar41;
  auVar82._20_4_ = auVar46._20_4_ * fVar42;
  auVar82._24_4_ = auVar46._24_4_ * fVar43;
  auVar82._28_4_ = fVar68;
  auVar13 = vsubps_avx(auVar13,auVar82);
  auVar67._8_4_ = 0x3f800000;
  auVar67._0_8_ = &DAT_3f8000003f800000;
  auVar67._12_4_ = 0x3f800000;
  auVar67._16_4_ = 0x3f800000;
  auVar67._20_4_ = 0x3f800000;
  auVar67._24_4_ = 0x3f800000;
  auVar67._28_4_ = 0x3f800000;
  fVar68 = auVar24._0_4_;
  fVar32 = auVar24._4_4_;
  auVar14._4_4_ = fVar32 * auVar58._4_4_;
  auVar14._0_4_ = fVar68 * auVar58._0_4_;
  fVar38 = auVar24._8_4_;
  auVar14._8_4_ = fVar38 * auVar58._8_4_;
  fVar39 = auVar24._12_4_;
  auVar14._12_4_ = fVar39 * auVar58._12_4_;
  fVar40 = auVar24._16_4_;
  auVar14._16_4_ = fVar40 * auVar58._16_4_;
  fVar47 = auVar24._20_4_;
  auVar14._20_4_ = fVar47 * auVar58._20_4_;
  fVar48 = auVar24._24_4_;
  auVar14._24_4_ = fVar48 * auVar58._24_4_;
  auVar14._28_4_ = auVar58._28_4_;
  auVar82 = vsubps_avx(auVar67,auVar14);
  auVar15._4_4_ = auVar13._4_4_ * (fVar32 + fVar32 * auVar82._4_4_);
  auVar15._0_4_ = auVar13._0_4_ * (fVar68 + fVar68 * auVar82._0_4_);
  auVar15._8_4_ = auVar13._8_4_ * (fVar38 + fVar38 * auVar82._8_4_);
  auVar15._12_4_ = auVar13._12_4_ * (fVar39 + fVar39 * auVar82._12_4_);
  auVar15._16_4_ = auVar13._16_4_ * (fVar40 + fVar40 * auVar82._16_4_);
  auVar15._20_4_ = auVar13._20_4_ * (fVar47 + fVar47 * auVar82._20_4_);
  auVar15._24_4_ = auVar13._24_4_ * (fVar48 + fVar48 * auVar82._24_4_);
  auVar15._28_4_ = auVar24._28_4_ + auVar82._28_4_;
  auVar24 = vminps_avx(auVar15,auVar67);
  auVar82 = ZEXT1232(ZEXT412(0)) << 0x20;
  local_200 = vmaxps_avx(auVar24,auVar82);
  fVar68 = local_200._0_4_;
  fVar77 = local_200._4_4_;
  fVar78 = local_200._8_4_;
  fVar79 = local_200._12_4_;
  fVar69 = local_200._16_4_;
  fVar71 = local_200._20_4_;
  fVar72 = local_200._24_4_;
  fVar32 = auVar46._0_4_ + fVar68 * fVar20;
  fVar38 = auVar46._4_4_ + fVar77 * fVar27;
  fVar39 = auVar46._8_4_ + fVar78 * fVar29;
  fVar40 = auVar46._12_4_ + fVar79 * fVar31;
  fVar41 = auVar46._16_4_ + fVar69 * fVar41;
  fVar42 = auVar46._20_4_ + fVar71 * fVar42;
  fVar43 = auVar46._24_4_ + fVar72 * fVar43;
  fVar44 = auVar80._0_4_ + fVar68 * fVar44;
  fVar47 = auVar80._4_4_ + fVar77 * fVar26;
  fVar48 = auVar80._8_4_ + fVar78 * fVar28;
  fVar49 = auVar80._12_4_ + fVar79 * fVar30;
  fVar50 = auVar80._16_4_ + fVar69 * fVar50;
  fVar51 = auVar80._20_4_ + fVar71 * fVar51;
  fVar52 = auVar80._24_4_ + fVar72 * fVar52;
  auVar24 = vsubps_avx(auVar22,auVar81);
  local_1c0._0_4_ = auVar81._0_4_ + fVar68 * auVar24._0_4_;
  local_1c0._4_4_ = auVar81._4_4_ + fVar77 * auVar24._4_4_;
  local_1c0._8_4_ = auVar81._8_4_ + fVar78 * auVar24._8_4_;
  local_1c0._12_4_ = auVar81._12_4_ + fVar79 * auVar24._12_4_;
  local_1c0._16_4_ = auVar81._16_4_ + fVar69 * auVar24._16_4_;
  local_1c0._20_4_ = auVar81._20_4_ + fVar71 * auVar24._20_4_;
  local_1c0._24_4_ = auVar81._24_4_ + fVar72 * auVar24._24_4_;
  local_1c0._28_4_ = auVar81._28_4_ + auVar24._28_4_;
  auVar65 = ZEXT3264(local_1c0);
  auVar24 = vsubps_avx(local_c0,local_a0);
  fVar20 = local_a0._0_4_ + fVar68 * auVar24._0_4_;
  fVar26 = local_a0._4_4_ + fVar77 * auVar24._4_4_;
  fVar27 = local_a0._8_4_ + fVar78 * auVar24._8_4_;
  fVar68 = local_a0._12_4_ + fVar79 * auVar24._12_4_;
  fVar28 = local_a0._16_4_ + fVar69 * auVar24._16_4_;
  fVar29 = local_a0._20_4_ + fVar71 * auVar24._20_4_;
  fVar30 = local_a0._24_4_ + fVar72 * auVar24._24_4_;
  fVar31 = local_a0._28_4_ + auVar24._28_4_;
  auVar37._0_4_ = fVar32 * fVar32 + fVar44 * fVar44;
  auVar37._4_4_ = fVar38 * fVar38 + fVar47 * fVar47;
  auVar37._8_4_ = fVar39 * fVar39 + fVar48 * fVar48;
  auVar37._12_4_ = fVar40 * fVar40 + fVar49 * fVar49;
  auVar37._16_4_ = fVar41 * fVar41 + fVar50 * fVar50;
  auVar37._20_4_ = fVar42 * fVar42 + fVar51 * fVar51;
  auVar37._24_4_ = fVar43 * fVar43 + fVar52 * fVar52;
  auVar37._28_4_ = auVar46._28_4_ + auVar12._28_4_ + auVar80._28_4_ + auVar46._28_4_;
  auVar24._4_4_ = fVar26 * fVar26;
  auVar24._0_4_ = fVar20 * fVar20;
  auVar24._8_4_ = fVar27 * fVar27;
  auVar24._12_4_ = fVar68 * fVar68;
  auVar24._16_4_ = fVar28 * fVar28;
  auVar24._20_4_ = fVar29 * fVar29;
  auVar24._24_4_ = fVar30 * fVar30;
  auVar24._28_4_ = auVar80._28_4_ + auVar46._28_4_;
  uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar54._4_4_ = uVar1;
  auVar54._0_4_ = uVar1;
  auVar54._8_4_ = uVar1;
  auVar54._12_4_ = uVar1;
  auVar54._16_4_ = uVar1;
  auVar54._20_4_ = uVar1;
  auVar54._24_4_ = uVar1;
  auVar54._28_4_ = uVar1;
  auVar12 = vcmpps_avx(auVar37,auVar24,2);
  auVar24 = vcmpps_avx(auVar54,local_1c0,2);
  fVar44 = (ray->super_RayK<1>).tfar;
  auVar55._4_4_ = fVar44;
  auVar55._0_4_ = fVar44;
  auVar55._8_4_ = fVar44;
  auVar55._12_4_ = fVar44;
  auVar55._16_4_ = fVar44;
  auVar55._20_4_ = fVar44;
  auVar55._24_4_ = fVar44;
  auVar55._28_4_ = fVar44;
  auVar13 = vcmpps_avx(local_1c0,auVar55,2);
  auVar24 = vandps_avx(auVar13,auVar24);
  fVar44 = pre->depth_scale;
  auVar24 = vandps_avx(auVar24,auVar12);
  auVar12._4_4_ = fVar44 * (fVar26 + fVar26);
  auVar12._0_4_ = fVar44 * (fVar20 + fVar20);
  auVar12._8_4_ = fVar44 * (fVar27 + fVar27);
  auVar12._12_4_ = fVar44 * (fVar68 + fVar68);
  auVar12._16_4_ = fVar44 * (fVar28 + fVar28);
  auVar12._20_4_ = fVar44 * (fVar29 + fVar29);
  auVar12._24_4_ = fVar44 * (fVar30 + fVar30);
  auVar12._28_4_ = fVar31 + fVar31;
  auVar12 = vcmpps_avx(local_1c0,auVar12,6);
  auVar24 = vandps_avx(auVar12,auVar24);
  auVar33 = vpslld_avx(auVar24._0_16_,0x1f);
  auVar34 = vpsrad_avx(auVar33,0x1f);
  auVar33 = vpslld_avx(auVar24._16_16_,0x1f);
  auVar33 = vpsrad_avx(auVar33,0x1f);
  auVar23._16_16_ = auVar33;
  auVar23._0_16_ = auVar34;
  auVar24 = auVar23 & ~local_80;
  if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar24 >> 0x7f,0) != '\0') ||
        (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar24 >> 0xbf,0) != '\0') ||
      (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar24[0x1f] < '\0') {
    auVar24 = vandnps_avx(local_80,auVar23);
    local_1a0 = vsubps_avx(local_e0,local_2a0);
    local_180 = vsubps_avx(local_100,local_120);
    local_160 = vsubps_avx(local_240,local_140);
    auVar12 = vcmpps_avx(auVar82,local_1a0,4);
    auVar82 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar13 = vcmpps_avx(auVar82,local_180,4);
    auVar13 = vorps_avx(auVar12,auVar13);
    auVar12 = vcmpps_avx(auVar82,local_160,4);
    auVar12 = vorps_avx(auVar13,auVar12);
    auVar13 = auVar24 & auVar12;
    if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar13 >> 0x7f,0) != '\0') ||
          (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar13 >> 0xbf,0) != '\0') ||
        (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar13[0x1f] < '\0')
    {
      auVar24 = vandps_avx(auVar12,auVar24);
      local_1e0 = ZEXT832(0) << 0x20;
      local_280 = auVar24;
      auVar61._8_4_ = 0x7f800000;
      auVar61._0_8_ = 0x7f8000007f800000;
      auVar61._12_4_ = 0x7f800000;
      auVar61._16_4_ = 0x7f800000;
      auVar61._20_4_ = 0x7f800000;
      auVar61._24_4_ = 0x7f800000;
      auVar61._28_4_ = 0x7f800000;
      auVar62 = ZEXT3264(auVar61);
      auVar12 = vblendvps_avx(auVar61,local_1c0,auVar24);
      auVar13 = vshufps_avx(auVar12,auVar12,0xb1);
      auVar13 = vminps_avx(auVar12,auVar13);
      auVar82 = vshufpd_avx(auVar13,auVar13,5);
      auVar13 = vminps_avx(auVar13,auVar82);
      auVar82 = vperm2f128_avx(auVar13,auVar13,1);
      auVar13 = vminps_avx(auVar13,auVar82);
      auVar12 = vcmpps_avx(auVar12,auVar13,0);
      auVar13 = auVar24 & auVar12;
      if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar13 >> 0x7f,0) != '\0') ||
            (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar13 >> 0xbf,0) != '\0') ||
          (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar13[0x1f] < '\0') {
        auVar24 = vandps_avx(auVar12,auVar24);
      }
      uVar16 = vmovmskps_avx(auVar24);
      uVar17 = 0;
      if (uVar16 != 0) {
        for (; (uVar16 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
        }
      }
      do {
        uVar19 = (ulong)uVar17;
        local_2b8 = *(uint *)(local_220 + uVar19 * 4);
        pGVar9 = (pSVar18->geometries).items[local_2b8].ptr;
        if ((pGVar9->mask & (ray->super_RayK<1>).mask) == 0) {
          *(undefined4 *)(local_280 + uVar19 * 4) = 0;
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            fVar44 = *(float *)(local_200 + uVar19 * 4);
            fVar20 = *(float *)(local_1e0 + uVar19 * 4);
            (ray->super_RayK<1>).tfar = *(float *)(local_1c0 + uVar19 * 4);
            (ray->Ng).field_0.field_0.x = *(float *)(local_1a0 + uVar19 * 4);
            (ray->Ng).field_0.field_0.y = *(float *)(local_180 + uVar19 * 4);
            (ray->Ng).field_0.field_0.z = *(float *)(local_160 + uVar19 * 4);
            ray->u = fVar44;
            ray->v = fVar20;
            ray->primID = (line->primIDs).field_0.i[uVar19];
            ray->geomID = local_2b8;
            ray->instID[0] = context->user->instID[0];
            ray->instPrimID[0] = context->user->instPrimID[0];
            return;
          }
          local_2d0 = *(float *)(local_1a0 + uVar19 * 4);
          local_2cc = *(undefined4 *)(local_180 + uVar19 * 4);
          local_2c8 = *(undefined4 *)(local_160 + uVar19 * 4);
          local_2c4 = *(undefined4 *)(local_200 + uVar19 * 4);
          local_2c0 = *(undefined4 *)(local_1e0 + uVar19 * 4);
          local_2bc = (line->primIDs).field_0.i[uVar19];
          local_2b4 = context->user->instID[0];
          local_2b0 = context->user->instPrimID[0];
          local_2a0._0_4_ = (ray->super_RayK<1>).tfar;
          (ray->super_RayK<1>).tfar = *(float *)(local_1c0 + uVar19 * 4);
          local_314 = -1;
          local_300.valid = &local_314;
          local_300.geometryUserPtr = pGVar9->userPtr;
          local_300.context = context->user;
          local_300.ray = (RTCRayN *)ray;
          local_300.hit = (RTCHitN *)&local_2d0;
          local_300.N = 1;
          local_260 = auVar65._0_32_;
          if (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_010b55ac:
            p_Var11 = context->args->filter;
            if (p_Var11 != (RTCFilterFunctionN)0x0) {
              if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar9->field_8).field_0x2 & 0x40) != 0)) {
                (*p_Var11)(&local_300);
                auVar62 = ZEXT3264(CONCAT428(0x7f800000,
                                             CONCAT424(0x7f800000,
                                                       CONCAT420(0x7f800000,
                                                                 CONCAT416(0x7f800000,
                                                                           CONCAT412(0x7f800000,
                                                                                     CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                auVar65 = ZEXT3264(local_260);
                pSVar18 = local_310;
              }
              if (*local_300.valid == 0) goto LAB_010b56b5;
            }
            (((Vec3f *)((long)local_300.ray + 0x30))->field_0).field_0.x = *(float *)local_300.hit;
            (((Vec3f *)((long)local_300.ray + 0x30))->field_0).field_0.y =
                 *(float *)(local_300.hit + 4);
            (((Vec3f *)((long)local_300.ray + 0x30))->field_0).field_0.z =
                 *(float *)(local_300.hit + 8);
            *(float *)((long)local_300.ray + 0x3c) = *(float *)(local_300.hit + 0xc);
            *(float *)((long)local_300.ray + 0x40) = *(float *)(local_300.hit + 0x10);
            *(float *)((long)local_300.ray + 0x44) = *(float *)(local_300.hit + 0x14);
            *(float *)((long)local_300.ray + 0x48) = *(float *)(local_300.hit + 0x18);
            *(float *)((long)local_300.ray + 0x4c) = *(float *)(local_300.hit + 0x1c);
            *(float *)((long)local_300.ray + 0x50) = *(float *)(local_300.hit + 0x20);
          }
          else {
            (*pGVar9->intersectionFilterN)(&local_300);
            auVar62 = ZEXT3264(CONCAT428(0x7f800000,
                                         CONCAT424(0x7f800000,
                                                   CONCAT420(0x7f800000,
                                                             CONCAT416(0x7f800000,
                                                                       CONCAT412(0x7f800000,
                                                                                 CONCAT48(0x7f800000
                                                                                          ,
                                                  0x7f8000007f800000)))))));
            auVar65 = ZEXT3264(local_260);
            pSVar18 = local_310;
            if (*local_300.valid != 0) goto LAB_010b55ac;
LAB_010b56b5:
            (ray->super_RayK<1>).tfar = (float)local_2a0._0_4_;
          }
          *(undefined4 *)(local_280 + uVar19 * 4) = 0;
          fVar44 = (ray->super_RayK<1>).tfar;
          auVar25._4_4_ = fVar44;
          auVar25._0_4_ = fVar44;
          auVar25._8_4_ = fVar44;
          auVar25._12_4_ = fVar44;
          auVar25._16_4_ = fVar44;
          auVar25._20_4_ = fVar44;
          auVar25._24_4_ = fVar44;
          auVar25._28_4_ = fVar44;
          auVar24 = vcmpps_avx(auVar65._0_32_,auVar25,2);
          local_280 = vandps_avx(auVar24,local_280);
        }
        if ((((((((local_280 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_280 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_280 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_280 >> 0x7f,0) == '\0') &&
              (local_280 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_280 >> 0xbf,0) == '\0') &&
            (local_280 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_280[0x1f]) {
          return;
        }
        auVar24 = vblendvps_avx(auVar62._0_32_,auVar65._0_32_,local_280);
        auVar12 = vshufps_avx(auVar24,auVar24,0xb1);
        auVar12 = vminps_avx(auVar24,auVar12);
        auVar13 = vshufpd_avx(auVar12,auVar12,5);
        auVar12 = vminps_avx(auVar12,auVar13);
        auVar13 = vperm2f128_avx(auVar12,auVar12,1);
        auVar12 = vminps_avx(auVar12,auVar13);
        auVar12 = vcmpps_avx(auVar24,auVar12,0);
        auVar13 = local_280 & auVar12;
        auVar24 = local_280;
        if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar13 >> 0x7f,0) != '\0') ||
              (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar13 >> 0xbf,0) != '\0') ||
            (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar13[0x1f] < '\0') {
          auVar24 = vandps_avx(auVar12,local_280);
        }
        uVar16 = vmovmskps_avx(auVar24);
        uVar17 = 0;
        if (uVar16 != 0) {
          for (; (uVar16 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
          }
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& line)
      {
        STAT3(normal.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; line.gather(v0,v1,geom);
        const vbool<M> valid = line.valid();
        FlatLinearCurveIntersector1<M>::intersect(valid,ray,context,geom,pre,v0,v1,Intersect1EpilogM<M,filter>(ray,context,line.geomID(),line.primID()));
      }